

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O2

void flat_mask_internal_dual(__m128i *th,__m128i *p,__m128i *q,int start,int end,__m128i *flat)

{
  __m128i alVar1;
  __m128i alVar2;
  short sVar3;
  ulong uVar4;
  long lVar5;
  short sVar6;
  undefined1 auVar7 [16];
  short sVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  uVar4 = (ulong)(uint)start;
  alVar1 = *q;
  auVar7 = psubusw((undefined1  [16])alVar1,(undefined1  [16])q[uVar4]);
  auVar9 = psubusw((undefined1  [16])q[uVar4],(undefined1  [16])alVar1);
  auVar9 = auVar9 | auVar7;
  alVar2 = *p;
  auVar10 = psubusw((undefined1  [16])alVar2,(undefined1  [16])p[uVar4]);
  auVar7 = psubusw((undefined1  [16])p[uVar4],(undefined1  [16])alVar2);
  auVar7 = auVar7 | auVar10;
  lVar5 = uVar4 * 0x10;
  while( true ) {
    sVar3 = auVar9._0_2_;
    sVar6 = auVar7._0_2_;
    auVar10._0_2_ = (ushort)(sVar6 < sVar3) * sVar3 | (ushort)(sVar6 >= sVar3) * sVar6;
    sVar3 = auVar9._2_2_;
    sVar6 = auVar7._2_2_;
    auVar10._2_2_ = (ushort)(sVar6 < sVar3) * sVar3 | (ushort)(sVar6 >= sVar3) * sVar6;
    sVar3 = auVar9._4_2_;
    sVar6 = auVar7._4_2_;
    auVar10._4_2_ = (ushort)(sVar6 < sVar3) * sVar3 | (ushort)(sVar6 >= sVar3) * sVar6;
    sVar3 = auVar9._6_2_;
    sVar6 = auVar7._6_2_;
    auVar10._6_2_ = (ushort)(sVar6 < sVar3) * sVar3 | (ushort)(sVar6 >= sVar3) * sVar6;
    sVar3 = auVar9._8_2_;
    sVar6 = auVar7._8_2_;
    auVar10._8_2_ = (ushort)(sVar6 < sVar3) * sVar3 | (ushort)(sVar6 >= sVar3) * sVar6;
    sVar3 = auVar9._10_2_;
    sVar6 = auVar7._10_2_;
    auVar10._10_2_ = (ushort)(sVar6 < sVar3) * sVar3 | (ushort)(sVar6 >= sVar3) * sVar6;
    sVar3 = auVar9._12_2_;
    sVar6 = auVar7._12_2_;
    sVar8 = auVar7._14_2_;
    auVar10._12_2_ = (ushort)(sVar6 < sVar3) * sVar3 | (ushort)(sVar6 >= sVar3) * sVar6;
    sVar3 = auVar9._14_2_;
    auVar10._14_2_ = (ushort)(sVar8 < sVar3) * sVar3 | (ushort)(sVar8 >= sVar3) * sVar8;
    start = start + 1;
    if (end <= start) break;
    auVar7 = *(undefined1 (*) [16])((long)p[1] + lVar5);
    auVar11 = psubusw((undefined1  [16])alVar2,auVar7);
    auVar9 = psubusw(auVar7,(undefined1  [16])alVar2);
    auVar9 = auVar9 | auVar11;
    sVar3 = auVar9._0_2_;
    auVar7._0_2_ = (ushort)((short)auVar10._0_2_ < sVar3) * sVar3 |
                   ((short)auVar10._0_2_ >= sVar3) * auVar10._0_2_;
    sVar3 = auVar9._2_2_;
    auVar7._2_2_ = (ushort)((short)auVar10._2_2_ < sVar3) * sVar3 |
                   ((short)auVar10._2_2_ >= sVar3) * auVar10._2_2_;
    sVar3 = auVar9._4_2_;
    auVar7._4_2_ = (ushort)((short)auVar10._4_2_ < sVar3) * sVar3 |
                   ((short)auVar10._4_2_ >= sVar3) * auVar10._4_2_;
    sVar3 = auVar9._6_2_;
    auVar7._6_2_ = (ushort)((short)auVar10._6_2_ < sVar3) * sVar3 |
                   ((short)auVar10._6_2_ >= sVar3) * auVar10._6_2_;
    sVar3 = auVar9._8_2_;
    auVar7._8_2_ = (ushort)((short)auVar10._8_2_ < sVar3) * sVar3 |
                   ((short)auVar10._8_2_ >= sVar3) * auVar10._8_2_;
    sVar3 = auVar9._10_2_;
    auVar7._10_2_ =
         (ushort)((short)auVar10._10_2_ < sVar3) * sVar3 |
         ((short)auVar10._10_2_ >= sVar3) * auVar10._10_2_;
    sVar3 = auVar9._12_2_;
    auVar7._12_2_ =
         (ushort)((short)auVar10._12_2_ < sVar3) * sVar3 |
         ((short)auVar10._12_2_ >= sVar3) * auVar10._12_2_;
    sVar3 = auVar9._14_2_;
    auVar7._14_2_ =
         (ushort)((short)auVar10._14_2_ < sVar3) * sVar3 |
         ((short)auVar10._14_2_ >= sVar3) * auVar10._14_2_;
    auVar9 = *(undefined1 (*) [16])((long)q[1] + lVar5);
    auVar10 = psubusw((undefined1  [16])alVar1,auVar9);
    auVar9 = psubusw(auVar9,(undefined1  [16])alVar1);
    auVar9 = auVar9 | auVar10;
    lVar5 = lVar5 + 0x10;
  }
  auVar7 = psubusw(auVar10,(undefined1  [16])*th);
  *(ushort *)*flat = -(ushort)(auVar7._0_2_ == 0);
  *(ushort *)((long)*flat + 2) = -(ushort)(auVar7._2_2_ == 0);
  *(ushort *)((long)*flat + 4) = -(ushort)(auVar7._4_2_ == 0);
  *(ushort *)((long)*flat + 6) = -(ushort)(auVar7._6_2_ == 0);
  *(ushort *)(*flat + 1) = -(ushort)(auVar7._8_2_ == 0);
  *(ushort *)((long)*flat + 10) = -(ushort)(auVar7._10_2_ == 0);
  *(ushort *)((long)*flat + 0xc) = -(ushort)(auVar7._12_2_ == 0);
  *(ushort *)((long)*flat + 0xe) = -(ushort)(auVar7._14_2_ == 0);
  return;
}

Assistant:

static inline void flat_mask_internal_dual(const __m128i *th, const __m128i *p,
                                           const __m128i *q, int start, int end,
                                           __m128i *flat) {
  int i;
  __m128i max =
      _mm_max_epi16(abs_diff16(q[start], q[0]), abs_diff16(p[start], p[0]));

  for (i = start + 1; i < end; ++i) {
    max = _mm_max_epi16(max, abs_diff16(p[i], p[0]));
    max = _mm_max_epi16(max, abs_diff16(q[i], q[0]));
  }

  __m128i ft;
  ft = _mm_subs_epu16(max, *th);

  const __m128i zero = _mm_setzero_si128();
  *flat = _mm_cmpeq_epi16(ft, zero);
}